

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O3

int coda_time_string_to_parts
              (char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
              int *second,int *musec)

{
  bool bVar1;
  char cVar2;
  undefined4 in_EAX;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  
  if (format == (char *)0x0) {
    pcVar6 = "format argument is NULL (%s:%u)";
    uVar5 = 0x5bc;
  }
  else if (str == (char *)0x0) {
    pcVar6 = "str argument is NULL (%s:%u)";
    uVar5 = 0x5c1;
  }
  else {
    auVar8._0_4_ = -(uint)(year == (int *)0x0);
    auVar8._4_4_ = -(uint)(month == (int *)0x0);
    auVar8._8_4_ = -(uint)(day == (int *)0x0);
    auVar8._12_4_ = -(uint)(hour == (int *)0x0);
    iVar3 = movmskps(in_EAX,auVar8);
    if ((((iVar3 == 0) && (minute != (int *)0x0)) && (second != (int *)0x0)) &&
       (musec != (int *)0x0)) {
      cVar2 = *format;
      if (cVar2 != '\0') {
        uVar7 = 0;
        bVar1 = false;
        do {
          if (cVar2 == '|' && !bVar1) {
            iVar3 = string_to_parts(format,str,year,month,day,hour,minute,second,musec);
            if (iVar3 == 0) {
              return 0;
            }
            bVar1 = false;
            do {
              lVar4 = (long)(int)uVar7;
              if (format[lVar4] == '\0') {
                coda_set_error(-0x68,"date/time argument (%s) did not match any of the formats (%s)"
                               ,str,format);
                return -1;
              }
              uVar7 = lVar4 + 1;
              cVar2 = format[lVar4 + 1];
              if (cVar2 != '\0') {
                pcVar6 = format + lVar4 + 2;
                do {
                  if (!bVar1 && cVar2 == '|') {
                    bVar1 = false;
                    break;
                  }
                  if (cVar2 == '\'') {
                    bVar1 = !bVar1;
                  }
                  uVar7 = (ulong)((int)uVar7 + 1);
                  cVar2 = *pcVar6;
                  pcVar6 = pcVar6 + 1;
                } while (cVar2 != '\0');
              }
              iVar3 = string_to_parts(format + lVar4 + 1,str,year,month,day,hour,minute,second,musec
                                     );
              if (iVar3 == 0) {
                return 0;
              }
            } while( true );
          }
          if (cVar2 == '\'') {
            bVar1 = !bVar1;
          }
          cVar2 = format[uVar7 + 1];
          uVar7 = uVar7 + 1;
        } while (cVar2 != '\0');
      }
      iVar3 = string_to_parts(format,str,year,month,day,hour,minute,second,musec);
      return iVar3;
    }
    pcVar6 = "date/time argument(s) are NULL (%s:%u)";
    uVar5 = 0x5c7;
  }
  coda_set_error(-100,pcVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                 ,uVar5);
  return -1;
}

Assistant:

LIBCODA_API int coda_time_string_to_parts(const char *format, const char *str, int *year, int *month, int *day,
                                          int *hour, int *minute, int *second, int *musec)
{
    int literal = 0;
    int n = 0;

    if (format == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "format argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (str == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "str argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    while (format[n] != '\0' && (literal || format[n] != '|'))
    {
        if (format[n] == '\'')
        {
            literal = !literal;
        }
        n++;
    }
    if (format[n] == '|')
    {
        int offset = 0;

        /* try multiple formats */
        while (1)
        {
            if (string_to_parts(&format[offset], str, year, month, day, hour, minute, second, musec) == 0)
            {
                /* found a format that works */
                return 0;
            }
            if (format[n] == '\0')
            {
                /* the string matched none of the formats */
                coda_set_error(CODA_ERROR_INVALID_DATETIME,
                               "date/time argument (%s) did not match any of the formats (%s)", str, format);
                return -1;
            }
            n++;
            offset = n;
            while (format[n] != '\0' && (literal || format[n] != '|'))
            {
                if (format[n] == '\'')
                {
                    literal = !literal;
                }
                n++;
            }
        }
    }

    return string_to_parts(format, str, year, month, day, hour, minute, second, musec);
}